

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

void __thiscall t_dart_generator::generate_enum(t_dart_generator *this,t_enum *tenum)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  ostream *poVar5;
  undefined4 extraout_var_00;
  size_t sVar6;
  _func_int **pp_Var7;
  long *plVar8;
  _Alloc_hider _Var9;
  t_dart_generator *ptVar10;
  char *pcVar11;
  string class_name;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string f_enum_name;
  string file_name;
  ofstream_with_content_based_conditional_update f_enum;
  char *local_318;
  long local_310;
  char local_308 [16];
  t_dart_generator *local_2f8;
  string local_2f0;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  _func_int *local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  ptVar10 = *(t_dart_generator **)CONCAT44(extraout_var,iVar3);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,ptVar10,
             (long)&(ptVar10->super_t_oop_generator).super_t_generator._vptr_t_generator +
             ((long *)CONCAT44(extraout_var,iVar3))[1]);
  get_file_name(&local_2b0,ptVar10,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  local_318 = local_308;
  pcVar1 = (this->src_dir_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,pcVar1,pcVar1 + (this->src_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_318);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_318,(ulong)local_2b0._M_dataplus._M_p);
  pp_Var7 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var7) {
    local_1c0 = *pp_Var7;
    lStack_1b8 = plVar4[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0 = *pp_Var7;
    local_1d0._0_8_ = (_func_int **)*plVar4;
  }
  local_1d0._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1d0);
  local_2d0 = &local_2c0;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_2c0 = *plVar8;
    lStack_2b8 = plVar4[3];
  }
  else {
    local_2c0 = *plVar8;
    local_2d0 = (long *)*plVar4;
  }
  local_2c8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_318,(char *)local_2d0,(allocator *)&local_2f0);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_318,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_318,local_310);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  dart_library(&local_2f0,this,&local_210);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  local_318 = local_308;
  lVar2 = *(long *)CONCAT44(extraout_var_00,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,lVar2,((long *)CONCAT44(extraout_var_00,iVar3))[1] + lVar2);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_318,local_318 + local_310);
  export_class_to_library(this,&local_230,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"class ",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,local_318,local_310);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270," ","");
  scope_up(this,(ostream *)local_1d0,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  local_2f8 = this;
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_2f0,
             &tenum->constants_);
  _Var9._M_p = local_2f0._M_dataplus._M_p;
  if (local_2f0._M_dataplus._M_p != (pointer)local_2f0._M_string_length) {
    do {
      iVar3 = *(int *)(*(long *)_Var9._M_p + 0x80);
      poVar5 = t_generator::indent((t_generator *)local_2f8,(ostream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"static const int ",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(*(long *)_Var9._M_p + 0x60),
                          *(long *)(*(long *)_Var9._M_p + 0x68));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var9._M_p = _Var9._M_p + 8;
    } while (_Var9._M_p != (pointer)local_2f0._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  ptVar10 = local_2f8;
  poVar5 = t_generator::indent((t_generator *)local_2f8,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"static final Set<int> VALID_VALUES = new Set.from([",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar3 = (ptVar10->super_t_oop_generator).super_t_generator.indent_;
  (ptVar10->super_t_oop_generator).super_t_generator.indent_ = iVar3 + 1;
  if (local_2f0._M_dataplus._M_p != (pointer)local_2f0._M_string_length) {
    _Var9._M_p = local_2f0._M_dataplus._M_p;
    pcVar11 = "";
    do {
      poVar5 = t_generator::indent((t_generator *)ptVar10,(ostream *)local_1d0);
      sVar6 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,sVar6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d0,*(char **)(*(long *)_Var9._M_p + 0x60),
                          *(long *)(*(long *)_Var9._M_p + 0x68));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var9._M_p = _Var9._M_p + 8;
      pcVar11 = ", ";
    } while (_Var9._M_p != (pointer)local_2f0._M_string_length);
    iVar3 = (ptVar10->super_t_oop_generator).super_t_generator.indent_ + -1;
  }
  (ptVar10->super_t_oop_generator).super_t_generator.indent_ = iVar3;
  poVar5 = t_generator::indent((t_generator *)ptVar10,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]);",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)ptVar10,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"static final Map<int, String> VALUES_TO_NAMES = {",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar3 = (ptVar10->super_t_oop_generator).super_t_generator.indent_;
  (ptVar10->super_t_oop_generator).super_t_generator.indent_ = iVar3 + 1;
  if (local_2f0._M_dataplus._M_p != (pointer)local_2f0._M_string_length) {
    _Var9._M_p = local_2f0._M_dataplus._M_p;
    pcVar11 = "";
    do {
      poVar5 = t_generator::indent((t_generator *)local_2f8,(ostream *)local_1d0);
      sVar6 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,sVar6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1d0,*(char **)(*(long *)_Var9._M_p + 0x60),
                          *(long *)(*(long *)_Var9._M_p + 0x68));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": \'",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(*(long *)_Var9._M_p + 0x60),
                          *(long *)(*(long *)_Var9._M_p + 0x68));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      _Var9._M_p = _Var9._M_p + 8;
      pcVar11 = ", ";
    } while (_Var9._M_p != (pointer)local_2f0._M_string_length);
    iVar3 = (local_2f8->super_t_oop_generator).super_t_generator.indent_ + -1;
    ptVar10 = local_2f8;
  }
  (ptVar10->super_t_oop_generator).super_t_generator.indent_ = iVar3;
  poVar5 = t_generator::indent((t_generator *)ptVar10,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"};",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_dataplus._M_p + ::endl_abi_cxx11_._M_string_length);
  poVar5 = (ostream *)local_1d0;
  scope_down(ptVar10,poVar5,&local_290);
  iVar3 = (int)poVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,iVar3);
  if ((long *)local_2f0._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::generate_enum(t_enum* tenum) {
  // Make output file
  string file_name = get_file_name(tenum->get_name());

  string f_enum_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_enum;
  f_enum.open(f_enum_name.c_str());

  // Comment and add library
  f_enum << autogen_comment() << dart_library(file_name) << endl;

  string class_name = tenum->get_name();
  export_class_to_library(file_name, class_name);
  f_enum << "class " << class_name;
  scope_up(f_enum);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();
    indent(f_enum) << "static const int " << (*c_iter)->get_name() << " = " << value << ";"
                   << endl;
  }

  // Create a static Set with all valid values for this enum
  f_enum << endl;

  indent(f_enum) << "static final Set<int> VALID_VALUES = new Set.from([" << endl;
  indent_up();
  bool firstValue = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // populate set
    indent(f_enum) << (firstValue ? "" : ", ");
    f_enum << (*c_iter)->get_name() << endl;
    firstValue = false;
  }
  indent_down();
  indent(f_enum) << "]);" << endl;

  indent(f_enum) << "static final Map<int, String> VALUES_TO_NAMES = {" << endl;
  indent_up();
  firstValue = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    indent(f_enum) << (firstValue ? "" : ", ");
    f_enum  << (*c_iter)->get_name() << ": '" << (*c_iter)->get_name() << "'" << endl;
    firstValue = false;
  }
  indent_down();
  indent(f_enum) << "};" << endl;

  scope_down(f_enum); // end class

  f_enum.close();
}